

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_algorithm_suite.cpp
# Opt level: O2

void copy_suite::unique_copy(void)

{
  initializer_list<int> input;
  initializer_list<int> __l;
  iterator iVar1;
  iterator __last;
  allocator_type local_c1;
  iterator local_c0;
  vector<int,_std::allocator<int>_> expect;
  int local_94 [3];
  circular_view<int,_18446744073709551615UL> copy;
  int copy_array [4];
  int array [4];
  circular_view<int,_18446744073709551615UL> span;
  
  span.member.data = array;
  span.member.cap = 4;
  span.member.size = 0;
  array[0] = 0;
  array[1] = 0;
  array[2] = 0;
  array[3] = 0;
  span.member.next = 4;
  copy.member.data = (pointer)0x160000000b;
  copy.member.cap = 0x2c00000021;
  copy.member.size = 0x3700000037;
  input._M_len = 6;
  input._M_array = (iterator)&copy;
  vista::circular_view<int,_18446744073709551615UL>::assign(&span,input);
  copy.member.data = copy_array;
  copy.member.cap = 4;
  copy.member.size = 0;
  copy.member.next = 4;
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&span);
  __last = vista::circular_view<int,_18446744073709551615UL>::end(&span);
  std::
  unique_copy<vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,std::back_insert_iterator<vista::circular_view<int,18446744073709551615ul>>>
            (iVar1,__last,&copy);
  local_94[0] = 0x21;
  local_94[1] = 0x2c;
  local_94[2] = 0x37;
  __l._M_len = 3;
  __l._M_array = local_94;
  std::vector<int,_std::allocator<int>_>::vector(&expect,__l,&local_c1);
  iVar1 = vista::circular_view<int,_18446744073709551615UL>::begin(&copy);
  local_c0 = vista::circular_view<int,_18446744073709551615UL>::end(&copy);
  boost::detail::
  test_all_eq_impl<std::ostream,vista::circular_view<int,18446744073709551615ul>::basic_iterator<int>,__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>
            ((basic_ostream<char,_std::char_traits<char>_> *)&std::cerr,
             "/workspace/llm4binary/github/license_all_cmakelists_1510/breese[P]vista/test/circular_view_algorithm_suite.cpp"
             ,0xc9,"void copy_suite::unique_copy()",iVar1,local_c0,
             (__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
             expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
             _M_start,(__normal_iterator<int_*,_std::vector<int,_std::allocator<int>_>_>)
                      expect.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish);
  std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
            (&expect.super__Vector_base<int,_std::allocator<int>_>);
  return;
}

Assistant:

void unique_copy()
{
    int array[4] = {};
    circular_view<int> span(array);
    span = { 11, 22, 33, 44, 55, 55 };
    int copy_array[4];
    circular_view<int> copy(copy_array);
    std::unique_copy(span.begin(), span.end(), std::back_inserter(copy));
    {
        std::vector<int> expect = { 33, 44, 55 };
        BOOST_TEST_ALL_EQ(copy.begin(), copy.end(),
                          expect.begin(), expect.end());
    }
}